

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTestDyndepBuildDiscoverNewOutputWithMultipleRules2::Run
          (BuildTestDyndepBuildDiscoverNewOutputWithMultipleRules2 *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  Builder *this_01;
  string err;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out $out.imp\nrule cp\n  command = cp $in $out\nbuild dd1: cp dd1-in\nbuild out1: touch || dd1\n  dyndep = dd1\nbuild dd2: cp dd2-in || dd1\nbuild out2: touch || dd2\n  dyndep = dd2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out1",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out2",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dd1-in",&local_62);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"ninja_dyndep_version = 1\nbuild out1 | out-twice.imp: dyndep\n",
               &local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dd2-in",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dd2",&local_62);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"ninja_dyndep_version = 1\nbuild out2 | out-twice.imp: dyndep\n",
               &local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    piVar1 = &(this->super_BuildTest).fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out1",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out2",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pTVar3 = g_current_test;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out1",&local_62);
    this_01 = &(this->super_BuildTest).builder_;
    pNVar5 = Builder::AddTarget(this_01,&local_60,&local_40);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xc86,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out2",&local_62);
    pNVar5 = Builder::AddTarget(this_01,&local_60,&local_40);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xc87,"builder_.AddTarget(\"out2\", &err)");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_40);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xc88,"\"\" == err");
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_40);
    testing::Test::Check
              (pTVar3,!bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xc8a,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("multiple rules generate out-twice.imp",&local_40);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xc8b,"\"multiple rules generate out-twice.imp\" == err");
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverNewOutputWithMultipleRules2) {
  // Verify that a dyndep file can be built and loaded to discover
  // a new output of an edge that is already the output of another
  // edge also discovered by dyndep.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out $out.imp\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd1: cp dd1-in\n"
"build out1: touch || dd1\n"
"  dyndep = dd1\n"
"build dd2: cp dd2-in || dd1\n" // make order predictable for test
"build out2: touch || dd2\n"
"  dyndep = dd2\n"
));
  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Create("dd1-in",
"ninja_dyndep_version = 1\n"
"build out1 | out-twice.imp: dyndep\n"
);
  fs_.Create("dd2-in", "");
  fs_.Create("dd2",
"ninja_dyndep_version = 1\n"
"build out2 | out-twice.imp: dyndep\n"
);
  fs_.Tick();
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  EXPECT_EQ("", err);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("multiple rules generate out-twice.imp", err);
}